

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

string * __thiscall
soul::heart::Parser::readVariableIdentifier_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  pointer pcVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  CompileMessage local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).currentStringValue._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).currentStringValue._M_string_length);
  bVar2 = matchesAnyIdentifier(this);
  if ((bVar2) &&
     (__s1 = (this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).currentType.text, __s1 != "$variableIdentifier")) {
    if (__s1 != (char *)0x0) {
      iVar3 = strcmp(__s1,"$variableIdentifier");
      if (iVar3 == 0) goto LAB_00234147;
    }
    CompileMessageHelpers::createMessage<std::__cxx11::string&>
              (&local_50,(CompileMessageHelpers *)0x1,none,0x288af3,(char *)__return_storage_ptr__,
               in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_50);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
      operator_delete(local_50.description._M_dataplus._M_p,
                      local_50.description.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00234147:
  if (__return_storage_ptr__->_M_string_length < 2) {
    CompileMessageHelpers::createMessage<std::__cxx11::string&>
              (&local_50,(CompileMessageHelpers *)0x1,none,0x288af3,(char *)__return_storage_ptr__,
               in_R9);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_50);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_50.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.description._M_dataplus._M_p != &local_50.description.field_2) {
      operator_delete(local_50.description._M_dataplus._M_p,
                      local_50.description.field_2._M_allocated_capacity + 1);
    }
  }
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x263554);
  return __return_storage_ptr__;
}

Assistant:

std::string readVariableIdentifier()
    {
        auto name = currentStringValue;

        if (matchesAnyIdentifier() && ! matches (Token::variableIdentifier))
            throwError (Errors::invalidVariableName (name));

        if (name.length() < 2)
            throwError (Errors::invalidVariableName (name));

        expect (Token::variableIdentifier);

        return name;
    }